

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O3

Time __thiscall helics::FederateInfo::checkTimeProperty(FederateInfo *this,int propId,Time defVal)

{
  pair<int,_TimeRepresentation<count_time<9,_long>_>_> *prop;
  pointer ppVar1;
  
  ppVar1 = (this->super_CoreFederateInfo).timeProps.
           super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVar1 == (this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return (Time)defVal.internalTimeCode;
    }
    if (ppVar1->first == propId) break;
    ppVar1 = ppVar1 + 1;
  }
  return (Time)(ppVar1->second).internalTimeCode;
}

Assistant:

Time FederateInfo::checkTimeProperty(int propId, Time defVal) const
{
    for (const auto& prop : timeProps) {
        if (prop.first == propId) {
            return prop.second;
        }
    }
    return defVal;
}